

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O0

cupdlp_dcs * cupdlp_dcs_spfree(cupdlp_dcs *A)

{
  long in_RDI;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = (cupdlp_dcs *)0x0;
  }
  else {
    cupdlp_dcs_free((void *)0x7f969a);
    cupdlp_dcs_free((void *)0x7f96a8);
    cupdlp_dcs_free((void *)0x7f96b6);
    local_8 = (cupdlp_dcs *)cupdlp_dcs_free((void *)0x7f96c0);
  }
  return local_8;
}

Assistant:

cupdlp_dcs *cupdlp_dcs_spfree(cupdlp_dcs *A) {
  if (!A) return (NULL); /* do nothing if A already NULL */
  cupdlp_dcs_free(A->p);
  cupdlp_dcs_free(A->i);
  cupdlp_dcs_free(A->x);
  return ((cupdlp_dcs *)cupdlp_dcs_free(
      A)); /* free the cupdlp_dcs struct and return NULL */
}